

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

size_t TtfUtil::LocaGlyphCount(size_t lLocaSize,void *pHead)

{
  ushort uVar1;
  domain_error *this;
  sbyte sVar2;
  
  uVar1 = *(ushort *)((long)pHead + 0x32) << 8 | *(ushort *)((long)pHead + 0x32) >> 8;
  sVar2 = 1;
  if (uVar1 != 0) {
    if (uVar1 != 1) {
      this = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this,"head table in inconsistent state. The font may be corrupted");
      __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    sVar2 = 2;
  }
  return (lLocaSize >> sVar2) - 1;
}

Assistant:

size_t LocaGlyphCount(size_t lLocaSize, const void * pHead)
{

	const Sfnt::FontHeader * pTable 
		= reinterpret_cast<const Sfnt::FontHeader *>(pHead);

	if (read(pTable->index_to_loc_format) 
		== Sfnt::FontHeader::ShortIndexLocFormat)
	// loca entries are two bytes and have been divided by two
		return (lLocaSize >> 1) - 1;
	
	if (read(pTable->index_to_loc_format) 
		== Sfnt::FontHeader::LongIndexLocFormat)
	 // loca entries are four bytes
		return (lLocaSize >> 2) - 1;

	//return -1;
	throw std::domain_error("head table in inconsistent state. The font may be corrupted");
}